

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

pointer __thiscall
absl::InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_>::data
          (InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_> *this)

{
  bool bVar1;
  undefined8 local_30;
  InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_> *this_local;
  
  bVar1 = allocated(this);
  if (bVar1) {
    local_30 = allocated_space(this);
  }
  else {
    local_30 = inlined_space(this);
  }
  return local_30;
}

Assistant:

pointer data() noexcept {
    return allocated() ? allocated_space() : inlined_space();
  }